

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bra.c
# Opt level: O0

SizeT PPC_Convert(Byte *data,SizeT size,UInt32 ip,int encoding)

{
  int iVar1;
  UInt32 dest;
  UInt32 src;
  SizeT i;
  int encoding_local;
  UInt32 ip_local;
  SizeT size_local;
  Byte *data_local;
  SizeT local_8;
  
  if (size < 4) {
    local_8 = 0;
  }
  else {
    for (i = 0; i <= size - 4; i = i + 4) {
      if (((int)(uint)data[i] >> 2 == 0x12) && ((data[i + 3] & 3) == 1)) {
        if (encoding == 0) {
          iVar1 = -(ip + (int)i);
        }
        else {
          iVar1 = ip + (int)i;
        }
        dest = iVar1 + ((data[i] & 3) << 0x18 | (uint)data[i + 1] << 0x10 | (uint)data[i + 2] << 8 |
                       data[i + 3] & 0xfffffffc);
        data[i] = (byte)(dest >> 0x18) & 3 | 0x48;
        data[i + 1] = (Byte)(dest >> 0x10);
        data[i + 2] = (Byte)(dest >> 8);
        data[i + 3] = data[i + 3] & 3;
        data[i + 3] = data[i + 3] | (byte)dest;
      }
    }
    local_8 = i;
  }
  return local_8;
}

Assistant:

SizeT PPC_Convert(Byte *data, SizeT size, UInt32 ip, int encoding)
{
  SizeT i;
  if (size < 4)
    return 0;
  size -= 4;
  for (i = 0; i <= size; i += 4)
  {
    if ((data[i] >> 2) == 0x12 && (data[i + 3] & 3) == 1)
    {
      UInt32 src = ((UInt32)(data[i + 0] & 3) << 24) |
        ((UInt32)data[i + 1] << 16) |
        ((UInt32)data[i + 2] << 8) |
        ((UInt32)data[i + 3] & (~3));
      
      UInt32 dest;
      if (encoding)
        dest = ip + (UInt32)i + src;
      else
        dest = src - (ip + (UInt32)i);
      data[i + 0] = (Byte)(0x48 | ((dest >> 24) &  0x3));
      data[i + 1] = (Byte)(dest >> 16);
      data[i + 2] = (Byte)(dest >> 8);
      data[i + 3] &= 0x3;
      data[i + 3] |= dest;
    }
  }
  return i;
}